

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
Image_Function_Helper::Histogram(HistogramForm4 histogram,Image *image)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ImageTemplate<unsigned_char> *in_RDX;
  code *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *histogramTable;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x11e82a);
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RDX);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RDX);
  (*in_RSI)(in_RDX,0,0,uVar1,uVar2,in_RDI);
  return in_RDI;
}

Assistant:

std::vector < uint32_t > Histogram( FunctionTable::HistogramForm4 histogram,
                                        const Image & image )
    {
        std::vector < uint32_t > histogramTable;

        histogram( image, 0, 0, image.width(), image.height(), histogramTable );

        return histogramTable;
    }